

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O3

void __thiscall
ParticleTest_GetCharge_Test<pica::Particle<(pica::Dimension)1>_>::TestBody
          (ParticleTest_GetCharge_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ParticleType particle;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  Particle local_40;
  
  BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
            (&local_40,(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this,
             (PositionType)0xc024000000000000,(PositionType)0x4024000000000000);
  local_60.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_be0080f172b1f37d;
  local_58.data_ =
       *(AssertHelperData **)(pica::ParticleTypes::types + 8 + (long)local_40.typeIndex * 0x10);
  testing::internal::CmpHelperEQ<double,double>
            (local_50,"pica::Constants<ChargeType>::electronCharge()","particle.getCharge()",
             (double *)&local_60,(double *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleTests.cpp"
               ,0xb3,message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(ParticleTest, GetCharge)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;

    ParticleType particle = this->randomParticle();
    ASSERT_EQ(pica::Constants<ChargeType>::electronCharge(), particle.getCharge());
}